

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

vector<const_bloaty::RangeMap_*,_std::allocator<const_bloaty::RangeMap_*>_> * __thiscall
bloaty::DualMaps::VmMaps(DualMaps *this)

{
  bool bVar1;
  vector<const_bloaty::RangeMap_*,_std::allocator<const_bloaty::RangeMap_*>_> *in_RDI;
  unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_> *map;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>,_std::allocator<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>_>_>
  *__range2;
  vector<const_bloaty::RangeMap_*,_std::allocator<const_bloaty::RangeMap_*>_> *ret;
  vector<const_bloaty::RangeMap_*,_std::allocator<const_bloaty::RangeMap_*>_> *this_00;
  __normal_iterator<const_std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>_*,_std::vector<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>,_std::allocator<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>_>_>_>
  local_28 [2];
  undefined1 local_11;
  
  local_11 = 0;
  this_00 = in_RDI;
  std::vector<const_bloaty::RangeMap_*,_std::allocator<const_bloaty::RangeMap_*>_>::vector
            ((vector<const_bloaty::RangeMap_*,_std::allocator<const_bloaty::RangeMap_*>_> *)0x1a435e
            );
  local_28[0]._M_current =
       (unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_> *)
       std::
       vector<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>,_std::allocator<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>_>_>
       ::begin((vector<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>,_std::allocator<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>_>_>
                *)in_RDI);
  std::
  vector<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>,_std::allocator<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>_>_>
  ::end((vector<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>,_std::allocator<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>_>_>
         *)in_RDI);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>_*,_std::vector<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>,_std::allocator<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>_>_>_>
                             *)this_00,
                            (__normal_iterator<const_std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>_*,_std::vector<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>,_std::allocator<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>_>_>_>
                             *)in_RDI), bVar1) {
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>_*,_std::vector<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>,_std::allocator<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>_>_>_>
    ::operator*(local_28);
    std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>::operator->
              ((unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_> *)0x1a43b4);
    std::vector<const_bloaty::RangeMap_*,_std::allocator<const_bloaty::RangeMap_*>_>::push_back
              (this_00,(value_type *)in_RDI);
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>_*,_std::vector<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>,_std::allocator<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>_>_>_>
    ::operator++(local_28);
  }
  return this_00;
}

Assistant:

std::vector<const RangeMap*> VmMaps() const {
    std::vector<const RangeMap*> ret;
    for (const auto& map : maps_) {
      ret.push_back(&map->vm_map);
    }
    return ret;
  }